

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubic_spline.cpp
# Opt level: O2

void __thiscall
CubicInterpolation::interpolation
          (CubicInterpolation *this,PointType *p1,double theta1,PointType *p2,double theta2)

{
  RealScalar RVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  SrcEvaluatorType srcEvaluator;
  double local_78;
  double ks1;
  CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_68;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  dp;
  
  dp.m_lhs = p2;
  dp.m_rhs = p1;
  RVar1 = Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
          ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                  *)&dp);
  dVar2 = cos(theta1);
  dVar2 = dVar2 * RVar1;
  dVar3 = sin(theta1);
  ks1 = dVar3 * RVar1;
  dVar3 = cos(theta2);
  dVar4 = sin(theta2);
  dVar5 = (p1->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
          [1];
  this->coeffs_[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[0] = (p1->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
             array[0];
  this->coeffs_[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[1] = dVar5;
  local_68.m_xpr = this->coeffs_ + 1;
  local_68.m_row = 0;
  local_68.m_col = 1;
  local_68.m_currentBlockRows = 1;
  this->coeffs_[1].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[0] = dVar2;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_(&local_68,&ks1);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::finished(&local_68);
  local_68.m_xpr = this->coeffs_ + 2;
  local_68.m_row = 0;
  local_68.m_col = 1;
  local_68.m_currentBlockRows = 1;
  this->coeffs_[2].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[0] = ((((dp.m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
               m_data.array[0] -
              ((dp.m_rhs)->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
              m_data.array[0]) * 3.0 - (dVar2 + dVar2)) - dVar3 * RVar1;
  local_78 = ((((dp.m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
               m_data.array[1] -
              ((dp.m_rhs)->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
              m_data.array[1]) * 3.0 - (ks1 + ks1)) - dVar4 * RVar1;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_(&local_68,&local_78);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::finished(&local_68);
  local_68.m_xpr = this->coeffs_ + 3;
  dVar5 = ((dp.m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
          m_data.array[0] -
          ((dp.m_rhs)->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
          m_data.array[0];
  local_68.m_row = 0;
  local_68.m_col = 1;
  local_68.m_currentBlockRows = 1;
  this->coeffs_[3].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[0] = (dVar2 - (dVar5 + dVar5)) + dVar3 * RVar1;
  dVar2 = ((dp.m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
          m_data.array[1] -
          ((dp.m_rhs)->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
          m_data.array[1];
  local_78 = (ks1 - (dVar2 + dVar2)) + dVar4 * RVar1;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_(&local_68,&local_78);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::finished(&local_68);
  (**(this->super_Curve<3,_2>)._vptr_Curve)(this);
  return;
}

Assistant:

void CubicInterpolation::interpolation(const PointType& p1,
                                       double theta1,
                                       const PointType& p2,
                                       double theta2) {
  auto dp = p2 - p1;

  double k = dp.norm();

  double kc1 = k * cos(theta1);
  double ks1 = k * sin(theta1);
  double kc2 = k * cos(theta2);
  double ks2 = k * sin(theta2);

  coeffs_[0] = p1;
  coeffs_[1] << kc1, ks1;
  coeffs_[2] << 3.0 * dp(0) - 2.0 * kc1 - kc2, 3.0 * dp(1) - 2.0 * ks1 - ks2;

  coeffs_[3] << -2.0 * dp(0) + kc1 + kc2, -2.0 * dp(1) + ks1 + ks2;

  computeLength();
}